

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O3

Gia_Man_t * Gia_ManReduceEquiv(Gia_Man_t *p,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  int iVar9;
  int *pCi2Lit;
  void *__s;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  size_t __size;
  bool bVar18;
  int local_3c;
  
  iVar16 = p->nRegs;
  lVar17 = (long)iVar16;
  __size = 8;
  if (0 < lVar17) {
    pVVar6 = p->vCos;
    iVar2 = pVVar6->nSize;
    uVar10 = (ulong)(uint)(iVar2 - iVar16);
    lVar12 = lVar17;
    do {
      if (((int)uVar10 < 0) || (iVar2 <= (int)uVar10)) goto LAB_00224b3c;
      iVar8 = pVVar6->pArray[uVar10];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00224b1d;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar8;
      pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value = 0;
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
    if (0 < iVar16) {
      pVVar6 = p->vCos;
      iVar2 = pVVar6->nSize;
      uVar10 = (ulong)(uint)(iVar2 - iVar16);
      iVar8 = 1;
      do {
        if (((int)uVar10 < 0) || (iVar2 <= (int)uVar10)) goto LAB_00224b3c;
        iVar9 = pVVar6->pArray[uVar10];
        if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_00224b1d;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar1 = p->pObjs + iVar9;
        uVar14 = (ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
        if (pGVar1[-uVar14].Value == 0) {
          pGVar1[-uVar14].Value = iVar8 * 2;
          iVar8 = iVar8 + 1;
        }
        uVar10 = uVar10 + 1;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
      __size = (long)(iVar8 * 2) << 2;
    }
  }
  pVVar6 = p->vCis;
  iVar2 = pVVar6->nSize;
  pCi2Lit = (int *)malloc((long)iVar2 * 4);
  memset(pCi2Lit,0xff,(long)iVar2 * 4);
  __s = malloc(__size);
  memset(__s,0xff,__size);
  local_3c = 0;
  if (iVar16 < 1) {
    bVar18 = false;
  }
  else {
    pVVar7 = p->vCos;
    iVar8 = pVVar7->nSize;
    iVar16 = -iVar16;
    iVar9 = 0;
LAB_002249e2:
    uVar11 = iVar8 + iVar16;
    if (((int)uVar11 < 0) || (iVar8 <= (int)uVar11)) {
LAB_00224b3c:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar11 = pVVar7->pArray[uVar11];
    if (((long)(int)uVar11 < 0) || (p->nObjs <= (int)uVar11)) {
LAB_00224b1d:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (p->pObjs != (Gia_Obj_t *)0x0) {
      uVar13 = iVar2 + iVar16;
      if (((int)uVar13 < 0) || (iVar2 <= (int)uVar13)) goto LAB_00224b3c;
      uVar3 = pVVar6->pArray[uVar13];
      if (((int)uVar3 < 0) || ((uint)p->nObjs <= uVar3)) goto LAB_00224b1d;
      pGVar1 = p->pObjs + (int)uVar11;
      uVar10 = *(ulong *)pGVar1;
      uVar15 = (uint)uVar10;
      uVar4 = pGVar1[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar4 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar10 = uVar10 >> 0x1d;
      if ((uVar11 == (uVar15 & 0x1fffffff)) && ((uVar10 & 1) == 0)) {
        pCi2Lit[uVar13] = 0;
        iVar9 = iVar9 + 1;
      }
      else {
        uVar10 = (ulong)((uint)uVar10 & 1 ^ uVar4);
        iVar5 = *(int *)((long)__s + uVar10 * 4);
        if (iVar5 == -1) {
          *(uint *)((long)__s + uVar10 * 4) = uVar3 * 2;
        }
        else {
          pCi2Lit[uVar13] = iVar5;
          local_3c = local_3c + 1;
        }
      }
      iVar16 = iVar16 + 1;
      if (iVar16 != 0) goto LAB_002249e2;
    }
    bVar18 = iVar9 != 0 || local_3c != 0;
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (bVar18) {
    p = Gia_ManDupDfsCiMap(p,pCi2Lit,(Vec_Int_t *)0x0);
  }
  if (pCi2Lit != (int *)0x0) {
    free(pCi2Lit);
  }
  return p;
}

Assistant:

Gia_Man_t * Gia_ManReduceEquiv( Gia_Man_t * p, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObjRi, * pObjRo;
    unsigned * pCi2Lit, * pMaps;
    int i, iLit, nFanins = 1, Counter0 = 0, Counter = 0;
    Gia_ManForEachRi( p, pObjRi, i )
        Gia_ObjFanin0(pObjRi)->Value = 0;
    Gia_ManForEachRi( p, pObjRi, i )
        if ( Gia_ObjFanin0(pObjRi)->Value == 0 )
            Gia_ObjFanin0(pObjRi)->Value = 2*nFanins++;
    pCi2Lit = ABC_FALLOC( unsigned, Gia_ManCiNum(p) );
    pMaps   = ABC_FALLOC( unsigned, 2 * nFanins );
    Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
    {
        iLit = Gia_ObjFanin0Copy( pObjRi );
        if ( Gia_ObjFaninId0p(p, pObjRi) == 0 && Gia_ObjFaninC0(pObjRi) == 0 ) // const 0 
            pCi2Lit[Gia_ManPiNum(p)+i] = 0, Counter0++;
        else if ( ~pMaps[iLit] ) // in this case, ID(pObj) > ID(pRepr) 
            pCi2Lit[Gia_ManPiNum(p)+i] = pMaps[iLit], Counter++; 
        else
            pMaps[iLit] = Abc_Var2Lit( Gia_ObjId(p, pObjRo), 0 );
    }
/*
    Gia_ManForEachCi( p, pObjRo, i )
    {
        if ( ~pCi2Lit[i] )
        {
            Gia_Obj_t * pObj0 = Gia_ObjRoToRi(p, pObjRo);
            Gia_Obj_t * pObj1 = Gia_ObjRoToRi(p, Gia_ManObj(p, pCi2Lit[i]));
            Gia_Obj_t * pFan0 = Gia_ObjChild0( p, Gia_ObjRoToRi(p, pObjRo) );
            Gia_Obj_t * pFan1 = Gia_ObjChild0( p, Gia_ObjRoToRi(p, Gia_ManObj(p, pCi2Lit[i])) );
            assert( pFan0 == pFan1 );
        }
    }
*/
//    if ( fVerbose )
//        printf( "ReduceEquiv detected %d constant regs and %d equivalent regs.\n", Counter0, Counter );
    ABC_FREE( pMaps );
    if ( Counter0 || Counter )
        pNew = Gia_ManDupDfsCiMap( p, (int *)pCi2Lit, NULL );
    else
        pNew = p;
    ABC_FREE( pCi2Lit );
    return pNew;
}